

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferPrecision.cpp
# Opt level: O3

IterateResult __thiscall glcts::TextureBufferPrecision::iterate(TextureBufferPrecision *this)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ContextType ctxType;
  NotSupportedError *this_00;
  char *description;
  long lVar6;
  byte bVar7;
  char *cs_code_with_precision [3];
  char *cs_code_without_precision [3];
  char *cs_code_with_global_precision [4];
  char *local_98;
  undefined8 local_90;
  char *local_88;
  char *local_78;
  undefined8 local_70;
  char *local_68;
  char *local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  
  if ((this->super_TestCaseBase).m_is_texture_buffer_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Texture buffer functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferPrecision.cpp"
               ,0x121);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::glslVersionIsES((this->super_TestCaseBase).m_glslVersion);
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x154);
  if (!bVar2) {
    bVar2 = glu::contextSupports(ctxType,(ApiType)0x13);
    bVar7 = 1;
    if (!bVar2) goto LAB_00d56636;
  }
  bVar7 = 1;
  lVar6 = 0;
  do {
    local_78 = "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\n";
    local_70 = *(undefined8 *)((long)&m_cs_code_declaration_without_precision + lVar6);
    local_68 = "\nvoid main()\n{\n    computeSSBO.value = imageLoad(image_buffer, 0).x;\n}";
    local_98 = "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\n";
    local_90 = *(undefined8 *)((long)&m_cs_code_declaration_with_precision + lVar6);
    local_88 = "\nvoid main()\n{\n    computeSSBO.value = imageLoad(image_buffer, 0).x;\n}";
    local_58 = "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\n";
    local_50 = *(undefined8 *)((long)&m_cs_code_global_precision + lVar6);
    local_40 = "\nvoid main()\n{\n    computeSSBO.value = imageLoad(image_buffer, 0).x;\n}";
    local_48 = local_70;
    bVar3 = verifyShaderCompilationStatus(this,0x91b9,&local_78,3,(uint)!bVar1);
    bVar4 = verifyShaderCompilationStatus(this,0x91b9,&local_98,3,1);
    bVar5 = verifyShaderCompilationStatus(this,0x91b9,&local_58,4,1);
    bVar7 = bVar5 & bVar7 & bVar4 & bVar3;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x18);
LAB_00d56636:
  lVar6 = 0;
  do {
    local_78 = "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\n";
    local_70 = *(undefined8 *)((long)&m_fs_code_declaration_without_precision + lVar6);
    local_68 = "\nvoid main()\n{\n    color = texelFetch( sampler_buffer, 0 );\n}";
    local_98 = "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\n";
    local_90 = *(undefined8 *)((long)&m_fs_code_declaration_with_precision + lVar6);
    local_88 = "\nvoid main()\n{\n    color = texelFetch( sampler_buffer, 0 );\n}";
    local_58 = "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\n";
    local_50 = *(undefined8 *)((long)&m_fs_code_global_precision + lVar6);
    local_40 = "\nvoid main()\n{\n    color = texelFetch( sampler_buffer, 0 );\n}";
    local_48 = local_70;
    bVar3 = verifyShaderCompilationStatus(this,0x8b30,&local_78,3,(uint)!bVar1);
    bVar4 = verifyShaderCompilationStatus(this,0x8b30,&local_98,3,1);
    bVar5 = verifyShaderCompilationStatus(this,0x8b30,&local_58,4,1);
    bVar7 = bVar7 & bVar5 & bVar4 & bVar3;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x18);
  if (bVar7 == 0) {
    description = "Fail";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar7 == 0),
             description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureBufferPrecision::iterate(void)
{
	/* Skip if required extensions are not supported. */
	if (!m_is_texture_buffer_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BUFFER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	glu::ContextType contextType   = m_context.getRenderContext().getType();
	glw::GLboolean   test_passed   = true;
	glw::GLint		 expected_fail = glu::glslVersionIsES(m_glslVersion) ? GL_FALSE : GL_TRUE;

	/* Default precision qualifiers for opaque types are not supported prior to GLSL 4.50. */
	if (glu::contextSupports(contextType, glu::ApiType::core(4, 5)) ||
		glu::contextSupports(contextType, glu::ApiType::es(3, 1)))
	{
		/* Compute Shader Tests */
		for (glw::GLuint i = 0; i < 3; ++i) /* For each from the set {imageBuffer, iimageBuffer, uimageBuffer} */
		{
			const char* cs_code_without_precision[3] = { m_cs_code_head, m_cs_code_declaration_without_precision[i],
														 m_cs_code_body };

			const char* cs_code_with_precision[3] = { m_cs_code_head, m_cs_code_declaration_with_precision[i],
													  m_cs_code_body };

			const char* cs_code_with_global_precision[4] = { m_cs_code_head, m_cs_code_global_precision[i],
															 m_cs_code_declaration_without_precision[i],
															 m_cs_code_body };

			test_passed =
				verifyShaderCompilationStatus(GL_COMPUTE_SHADER, cs_code_without_precision, 3, expected_fail) &&
				test_passed;
			test_passed =
				verifyShaderCompilationStatus(GL_COMPUTE_SHADER, cs_code_with_precision, 3, GL_TRUE) && test_passed;
			test_passed = verifyShaderCompilationStatus(GL_COMPUTE_SHADER, cs_code_with_global_precision, 4, GL_TRUE) &&
						  test_passed;
		}
	}

	/* Fragment Shader Tests */
	for (glw::GLuint i = 0; i < 3; ++i) /* For each from the set {samplerBuffer, isamplerBuffer, usamplerBuffer} */
	{
		const char* fs_code_without_precision[3] = { m_fs_code_head, m_fs_code_declaration_without_precision[i],
													 m_fs_code_body };

		const char* fs_code_with_precision[3] = { m_fs_code_head, m_fs_code_declaration_with_precision[i],
												  m_fs_code_body };

		const char* fs_code_with_global_precision[4] = { m_fs_code_head, m_fs_code_global_precision[i],
														 m_fs_code_declaration_without_precision[i], m_fs_code_body };

		test_passed = verifyShaderCompilationStatus(GL_FRAGMENT_SHADER, fs_code_without_precision, 3, expected_fail) &&
					  test_passed;
		test_passed =
			verifyShaderCompilationStatus(GL_FRAGMENT_SHADER, fs_code_with_precision, 3, GL_TRUE) && test_passed;
		test_passed =
			verifyShaderCompilationStatus(GL_FRAGMENT_SHADER, fs_code_with_global_precision, 4, GL_TRUE) && test_passed;
	}

	if (test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}